

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O1

token * attribute_context(dmr_C *C,token *token,symbol *attr,decl_state *ctx)

{
  bool bVar1;
  undefined8 *ptr;
  token *ptVar2;
  longlong lVar3;
  long lVar4;
  int iVar5;
  expression *local_58;
  expression *args [3];
  expression *local_38;
  expression *expr;
  
  iVar5 = 0;
  ptr = (undefined8 *)dmrC_allocator_allocate(&C->S->context_allocator,0);
  ptVar2 = dmrC_expect_token(C,token,0x28,"after context attribute");
  do {
    if ((((ulong)ptVar2->pos & 0x3f) == 0x11) && ((ptVar2->field_2).special == 0x29)) break;
    local_38 = (expression *)0x0;
    ptVar2 = dmrC_conditional_expression(C,ptVar2,&local_38);
    if (local_38 == (expression *)0x0) {
LAB_0011cc11:
      bVar1 = false;
    }
    else {
      if (iVar5 < 3) {
        lVar4 = (long)iVar5;
        iVar5 = iVar5 + 1;
        args[lVar4 + -1] = local_38;
      }
      if ((((ulong)ptVar2->pos & 0x3f) != 0x11) || ((ptVar2->field_2).special != 0x2c))
      goto LAB_0011cc11;
      ptVar2 = ptVar2->next;
      bVar1 = true;
    }
  } while (bVar1);
  switch(iVar5) {
  case 0:
    dmrC_sparse_error(C,ptVar2->pos,"expected context input/output values");
    break;
  case 1:
    lVar3 = dmrC_get_expression_value(C,local_58);
    *(int *)(ptr + 1) = (int)lVar3;
    break;
  case 2:
    lVar3 = dmrC_get_expression_value(C,local_58);
    *(int *)(ptr + 1) = (int)lVar3;
    args[1] = args[0];
    goto LAB_0011cc78;
  case 3:
    *ptr = local_58;
    lVar3 = dmrC_get_expression_value(C,args[0]);
    *(int *)(ptr + 1) = (int)lVar3;
LAB_0011cc78:
    lVar3 = dmrC_get_expression_value(C,args[1]);
    *(int *)((long)ptr + 0xc) = (int)lVar3;
    break;
  default:
    goto switchD_0011cc2e_default;
  }
  if (iVar5 != 0) {
switchD_0011cc2e_default:
    ptrlist_add((ptr_list **)&(ctx->ctype).contexts,ptr,&C->ptrlist_allocator);
  }
  ptVar2 = dmrC_expect_token(C,ptVar2,0x29,"after context attribute");
  return ptVar2;
}

Assistant:

static struct token *attribute_context(struct dmr_C *C, struct token *token, struct symbol *attr, struct decl_state *ctx)
{
        (void) attr;
	struct context *context = (struct context *)dmrC_allocator_allocate(&C->S->context_allocator, 0);
	struct expression *args[3];
	int argc = 0;

	token = dmrC_expect_token(C, token, '(', "after context attribute");
	while (!dmrC_match_op(token, ')')) {
		struct expression *expr = NULL;
		token = dmrC_conditional_expression(C, token, &expr);
		if (!expr)
			break;
		if (argc < 3)
			args[argc++] = expr;
		if (!dmrC_match_op(token, ','))
			break;
		token = token->next;
	}

	switch(argc) {
	case 0:
		dmrC_sparse_error(C, token->pos, "expected context input/output values");
		break;
	case 1:
		context->in = (unsigned int)dmrC_get_expression_value(C, args[0]);
		break;
	case 2:
		context->in = (unsigned int)dmrC_get_expression_value(C, args[0]);
		context->out = (unsigned int)dmrC_get_expression_value(C, args[1]);
		break;
	case 3:
		context->context_expr = args[0];
		context->in = (unsigned int)dmrC_get_expression_value(C, args[1]);
		context->out = (unsigned int)dmrC_get_expression_value(C, args[2]);
		break;
	}

	if (argc)
		dmrC_add_context(C, &ctx->ctype.contexts, context);

	token = dmrC_expect_token(C, token, ')', "after context attribute");
	return token;
}